

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sstring_view_archive.hpp
# Opt level: O2

void pstore::serialize::serializer<pstore::sstring_view<std::shared_ptr<char_const>>,void>::
     readsv<pstore::serialize::archive::database_reader&>(database_reader *archive,value_type *str)

{
  size_t length;
  
  length = string_helper::read_length<pstore::serialize::archive::database_reader&>(archive);
  read_string_view(str,archive->db_,(typed_address<char>)(archive->addr_).a_,length);
  address::operator+=(&archive->addr_,length);
  return;
}

Assistant:

static void readsv (DBReader && archive, value_type & str) {
                std::size_t const length =
                    string_helper::read_length (std::forward<DBReader> (archive));
                new (&str) value_type (read_string_view (
                    archive.get_db (), typed_address<char> (archive.get_address ()), length));
                archive.skip (length);
            }